

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  pointer *ppVVar1;
  undefined4 uVar2;
  RenderTarget *pRVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [16];
  bool bVar9;
  int i;
  GLuint GVar10;
  int iVar11;
  long lVar12;
  ostream *poVar13;
  bool *compile_error;
  ulong uVar14;
  bool bVar15;
  uint width;
  char *pcVar16;
  ulong uVar17;
  uint height;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  allocator_type local_209;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  ios_base local_138 [264];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar12 = 0;
  do {
    *(uint *)((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar12 * 4) =
         num_groups->m_data[lVar12] * param_1->m_data[lVar12];
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)&data);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &data.
                super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "\n#extension GL_OES_shader_image_atomic : enable",0x2f);
  }
  ppVVar1 = &data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppVVar1,"\nlayout(local_size_x = ",0x17);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)ppVVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", local_size_y = ",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", local_size_z = ",0x11);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,
             ") in;\nlayout(r32ui, binding=0) coherent uniform mediump uimage2D g_image1;\nlayout(r32ui, binding=1) uniform mediump uimage2D g_image2;\nconst uvec3 kGlobalSize = uvec3("
             ,0xa7);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13,
             ");\nvoid main() {\n  if (gl_GlobalInvocationID.x >= kGlobalSize.x || gl_GlobalInvocationID.y >= kGlobalSize.y) return;\n  uvec4 color = uvec4(gl_GlobalInvocationID.x + gl_GlobalInvocationID.y);"
             ,0xbe);
  bVar9 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_OES_shader_image_atomic");
  if (bVar9) {
    anon_unknown_0::Output("Using imageAtomicAdd");
    lVar12 = 0xfd;
    pcVar16 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), uvec4(0));\n  imageAtomicAdd(g_image1, ivec2(gl_GlobalInvocationID), color.x);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  else {
    anon_unknown_0::Output("Function imageAtomicAdd not supported, using imageStore");
    lVar12 = 0xb7;
    pcVar16 = 
    "\n  imageStore(g_image1, ivec2(gl_GlobalInvocationID), color);\n  uvec4 c = imageLoad(g_image1, ivec2(gl_GlobalInvocationID));\n  imageStore(g_image2, ivec2(gl_GlobalInvocationID), c);\n}"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppVVar1,pcVar16,lVar12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  std::ios_base::~ios_base(local_138);
  GVar10 = ComputeShaderBase::CreateComputeProgram
                     (&this->super_ComputeShaderBase,(string *)&display);
  this->m_program = GVar10;
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(display.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
    GVar10 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar10);
  bVar9 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar9) {
    width = num_groups->m_data[0] * param_1->m_data[0];
    height = num_groups->m_data[1] * param_1->m_data[1];
    iVar11 = height * width;
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector(&data,(ulong)(num_groups->m_data[2] * param_1->m_data[2] * iVar11),
           (allocator_type *)&display);
    textures = this->m_texture;
    glu::CallLogWrapper::glGenTextures(this_00,2,textures);
    lVar12 = 0;
    bVar9 = true;
    do {
      bVar15 = bVar9;
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,textures[lVar12]);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8236,width,height);
      glu::CallLogWrapper::glTexSubImage2D
                (this_00,0xde1,0,0,0,width,height,0x8d94,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      lVar12 = 1;
      bVar9 = false;
    } while (bVar15);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[1],0,'\0',0,0x88b9,0x8236);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      GVar10 = this->m_dispatch_buffer;
      if (GVar10 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
        GVar10 = this->m_dispatch_buffer;
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar10);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glActiveTexture(this_00,0x84c1);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&display,(long)iVar11,(allocator_type *)&colorData);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&colorData,(long)(iVar11 * 4),&local_209);
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,height,0x1908,0x1401,
               colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glDeleteTextures(this_00,2,textures);
    auVar8 = _DAT_01a2bf40;
    if (0 < iVar11 * 4) {
      lVar12 = 0;
      do {
        uVar2 = *(undefined4 *)
                 (colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar12);
        uVar14 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar14;
        auVar4[0xc] = (char)((uint)uVar2 >> 0x18);
        auVar5[8] = (char)((uint)uVar2 >> 0x10);
        auVar5._0_8_ = uVar14;
        auVar5[9] = 0;
        auVar5._10_3_ = auVar4._10_3_;
        auVar7._5_8_ = 0;
        auVar7._0_5_ = auVar5._8_5_;
        auVar6[4] = (char)((uint)uVar2 >> 8);
        auVar6._0_4_ = (int)uVar14;
        auVar6[5] = 0;
        auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
        auVar19._0_8_ = (double)(int)uVar14;
        auVar19._8_8_ = (double)auVar6._4_4_;
        auVar18._0_8_ = (double)auVar5._8_4_;
        auVar18._8_8_ = (double)(uint3)(auVar4._10_3_ >> 0x10);
        auVar19 = divpd(auVar19,auVar8);
        auVar18 = divpd(auVar18,auVar8);
        *(ulong *)display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)lVar12 >> 2].m_data =
             CONCAT44((float)auVar19._8_8_,(float)auVar19._0_8_);
        *(ulong *)(display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)lVar12 >> 2].m_data + 2) =
             CONCAT44((float)auVar18._8_8_,(float)auVar18._0_8_);
        lVar12 = lVar12 + 4;
      } while (lVar12 < iVar11 * 4);
    }
    if (0 < (int)height) {
      pRVar3 = (this->super_ComputeShaderBase).renderTarget;
      lVar12 = 0;
      uVar14 = 0;
      bVar9 = false;
      do {
        if (0 < (int)width) {
          uVar17 = 0;
          do {
            if (((long)uVar14 < (long)pRVar3->m_height) && ((long)uVar17 < (long)pRVar3->m_width)) {
              fVar20 = (float)((int)uVar14 + (int)uVar17) / 255.0;
              iVar11 = (int)lVar12 + (int)uVar17;
              fVar21 = display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0] - fVar20;
              fVar22 = -fVar21;
              if (-fVar21 <= fVar21) {
                fVar22 = fVar21;
              }
              if (fVar22 <= (this->super_ComputeShaderBase).g_color_eps.m_data[0] + 0.003921569) {
                fVar21 = display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1] + -1.0;
                fVar22 = -fVar21;
                if (-fVar21 <= fVar21) {
                  fVar22 = fVar21;
                }
                if (fVar22 <= (this->super_ComputeShaderBase).g_color_eps.m_data[1]) {
                  fVar21 = display.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[2] + -1.0;
                  fVar22 = -fVar21;
                  if (-fVar21 <= fVar21) {
                    fVar22 = fVar21;
                  }
                  if (fVar22 <= (this->super_ComputeShaderBase).g_color_eps.m_data[2]) {
                    fVar21 = display.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[3] + -1.0;
                    fVar22 = -fVar21;
                    if (-fVar21 <= fVar21) {
                      fVar22 = fVar21;
                    }
                    if (fVar22 <= (this->super_ComputeShaderBase).g_color_eps.m_data[3])
                    goto LAB_00c0ca7b;
                  }
                }
              }
              anon_unknown_0::Output
                        ("Got red: %f , expected %f, at (%d, %d)",
                         (double)display.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0],
                         SUB84((double)fVar20,0));
              goto LAB_00c0cabd;
            }
LAB_00c0ca7b:
            uVar17 = uVar17 + 1;
          } while (width != uVar17);
        }
        uVar14 = uVar14 + 1;
        bVar9 = height <= uVar14;
        lVar12 = lVar12 + (ulong)width;
      } while (uVar14 != height);
    }
    bVar9 = true;
LAB_00c0cabd:
    if (colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)colorData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)colorData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(display.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (data.
        super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.
                            super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<uvec4> data(kSize);
		glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, kWidth, kHeight);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kWidth, kHeight, GL_RED_INTEGER, GL_UNSIGNED_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4>	display(kWidth * kHeight);
		std::vector<GLubyte> colorData(kWidth * kHeight * 4);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
		glDeleteTextures(2, m_texture);

		for (int i = 0; i < kWidth * kHeight * 4; i += 4)
		{
			display[i / 4] =
				vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
					 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
		}

		/* As the colors are converted R8->Rx and then read back as Rx->R8,
		 need to add both conversions to the epsilon. */
		vec4 kColorEps = g_color_eps;
		kColorEps.x() += 1.f / ((1 << 8) - 1.0f);
		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f, 1.0f, 1.0f, 1.0f);
				if (!ColorEqual(display[y * kWidth + x], c, kColorEps))
				{
					Output("Got red: %f , expected %f, at (%d, %d)", display[y * kWidth + x].x(), c.x(), x, y);
					return false;
				}
			}
		}

		return true;
	}